

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Block_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Block_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this,
             Dispatch_State *t_ss)

{
  Conversion_Saves *pCVar1;
  Type_Conversions *pTVar2;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *pAVar3;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t i;
  long lVar4;
  Boxed_Value BVar5;
  Scope_Push_Pop spp;
  Scope_Push_Pop local_50;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *local_48;
  undefined1 local_40 [16];
  
  local_48 = &this->
              super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>;
  chaiscript::detail::Dispatch_Engine::new_scope(*(Stack_Holder **)(in_RDX + 8));
  pCVar1 = t_ss[2].m_conversions.m_saves._M_data;
  pTVar2 = t_ss[2].m_conversions.m_conversions._M_data;
  for (lVar4 = 0; pAVar3 = local_48, ((long)pCVar1 - (long)pTVar2 >> 3) + -1 != lVar4;
      lVar4 = lVar4 + 1) {
    AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
               local_40,*(Dispatch_State **)
                         ((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                                 _M_rwlock + lVar4 * 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  }
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            (local_48,(Dispatch_State *)
                      t_ss[2].m_conversions.m_saves._M_data[-1].saves.
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  detail::Scope_Push_Pop::~Scope_Push_Pop(&local_50);
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)pAVar3;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

        const auto num_children = this->children.size();
        for (size_t i = 0; i < num_children - 1; ++i) {
          this->children[i]->eval(t_ss);
        }
        return this->children.back()->eval(t_ss);
      }